

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

TypeInfo google::protobuf::internal::UntypedMapBase::GetTypeInfoDynamic
                   (TypeKind key_type,TypeKind value_type,MessageLite *value_prototype_if_message)

{
  byte bVar1;
  unsigned_short uVar2;
  ulong uVar3;
  Offsets OVar4;
  size_t local_28;
  
  local_28 = 8;
  OVar4 = AlignAndAddSizeDynamic(8,key_type,(MessageLite *)0x0,&local_28);
  OVar4 = AlignAndAddSizeDynamic(OVar4.end,value_type,value_prototype_if_message,&local_28);
  uVar3 = (OVar4.end + local_28) - 1;
  uVar2 = Narrow<unsigned_short,unsigned_long>(uVar3 - uVar3 % local_28);
  bVar1 = Narrow<unsigned_char,unsigned_long>(OVar4.start);
  return (TypeInfo)
         ((uint)uVar2 | (uint)bVar1 << 0x10 | (uint)(byte)(value_type << 4 | key_type & 0xf) << 0x18
         );
}

Assistant:

UntypedMapBase::TypeInfo UntypedMapBase::GetTypeInfoDynamic(
    TypeKind key_type, TypeKind value_type,
    const MessageLite* value_prototype_if_message) {
  size_t max_align = alignof(NodeBase);
  const auto key_offsets =
      AlignAndAddSizeDynamic(sizeof(NodeBase), key_type, nullptr, max_align);
  const auto value_offsets = AlignAndAddSizeDynamic(
      key_offsets.end, value_type, value_prototype_if_message, max_align);
  return TypeInfo{
      Narrow<uint16_t>(AlignTo(value_offsets.end, max_align, max_align)),
      Narrow<uint8_t>(value_offsets.start), static_cast<uint8_t>(key_type),
      static_cast<uint8_t>(value_type)};
}